

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurfmt.cpp
# Opt level: O0

void __thiscall
icu_63::PluralFormat::parseType
          (PluralFormat *this,UnicodeString *source,NFRule *rbnfLenientScanner,Formattable *result,
          FieldPosition *pos)

{
  int iVar1;
  int32_t iVar2;
  UMessagePatternPartType UVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  UnicodeString *this_00;
  Part *pPVar7;
  UnicodeString local_180;
  int32_t local_13c;
  undefined1 local_138 [4];
  int32_t length;
  UnicodeString currArg;
  Part *partLimit;
  Part *partStart;
  Part *partSelector;
  int matchedIndex;
  UnicodeString *pattern;
  undefined1 local_c0 [8];
  UnicodeString matchedWord;
  UnicodeString keyword;
  int startingAt;
  int count;
  int currMatchIndex;
  int partIndex;
  FieldPosition *pos_local;
  Formattable *result_local;
  NFRule *rbnfLenientScanner_local;
  UnicodeString *source_local;
  PluralFormat *this_local;
  
  iVar2 = MessagePattern::countParts(&this->msgPattern);
  if (iVar2 == 0) {
    FieldPosition::setBeginIndex(pos,-1);
    FieldPosition::setEndIndex(pos,-1);
  }
  else {
    count = 0;
    iVar2 = MessagePattern::countParts(&this->msgPattern);
    keyword.fUnion._48_4_ = FieldPosition::getBeginIndex(pos);
    if ((int)keyword.fUnion._48_4_ < 0) {
      keyword.fUnion._48_4_ = 0;
    }
    UnicodeString::UnicodeString((UnicodeString *)((long)&matchedWord.fUnion + 0x30));
    UnicodeString::UnicodeString((UnicodeString *)local_c0);
    this_00 = MessagePattern::getPatternString(&this->msgPattern);
    partSelector._4_4_ = -1;
    iVar1 = count;
    while (count = iVar1, count < iVar2) {
      pPVar7 = MessagePattern::getPart(&this->msgPattern,count);
      UVar3 = MessagePattern::Part::getType(pPVar7);
      iVar1 = count + 1;
      if (UVar3 == UMSGPAT_PART_TYPE_ARG_SELECTOR) {
        pPVar7 = MessagePattern::getPart(&this->msgPattern,count + 1);
        UVar3 = MessagePattern::Part::getType(pPVar7);
        iVar1 = count + 2;
        if (UVar3 == UMSGPAT_PART_TYPE_MSG_START) {
          currArg.fUnion._48_8_ = MessagePattern::getPart(&this->msgPattern,count + 2);
          UVar3 = MessagePattern::Part::getType((Part *)currArg.fUnion._48_8_);
          iVar1 = count + 3;
          if (UVar3 == UMSGPAT_PART_TYPE_MSG_LIMIT) {
            iVar4 = MessagePattern::Part::getLimit(pPVar7);
            iVar5 = MessagePattern::Part::getIndex((Part *)currArg.fUnion._48_8_);
            iVar6 = MessagePattern::Part::getLimit(pPVar7);
            UnicodeString::tempSubString((UnicodeString *)local_138,this_00,iVar4,iVar5 - iVar6);
            if (rbnfLenientScanner == (NFRule *)0x0) {
              startingAt = UnicodeString::indexOf
                                     (source,(UnicodeString *)local_138,keyword.fUnion._48_4_);
            }
            else {
              local_13c = -1;
              startingAt = NFRule::findTextLenient
                                     (rbnfLenientScanner,source,(UnicodeString *)local_138,
                                      keyword.fUnion._48_4_,&local_13c);
            }
            if ((-1 < startingAt) && (partSelector._4_4_ <= startingAt)) {
              iVar4 = UnicodeString::length((UnicodeString *)local_138);
              iVar5 = UnicodeString::length((UnicodeString *)local_c0);
              if (iVar5 < iVar4) {
                partSelector._4_4_ = startingAt;
                UnicodeString::operator=((UnicodeString *)local_c0,(UnicodeString *)local_138);
                iVar4 = MessagePattern::Part::getLimit(pPVar7);
                iVar5 = MessagePattern::Part::getIndex((Part *)currArg.fUnion._48_8_);
                iVar6 = MessagePattern::Part::getLimit(pPVar7);
                UnicodeString::tempSubString(&local_180,this_00,iVar4,iVar5 - iVar6);
                UnicodeString::operator=
                          ((UnicodeString *)((long)&matchedWord.fUnion + 0x30),&local_180);
                UnicodeString::~UnicodeString(&local_180);
              }
            }
            UnicodeString::~UnicodeString((UnicodeString *)local_138);
          }
        }
      }
    }
    if (partSelector._4_4_ < 0) {
      FieldPosition::setBeginIndex(pos,-1);
      FieldPosition::setEndIndex(pos,-1);
    }
    else {
      FieldPosition::setBeginIndex(pos,partSelector._4_4_);
      iVar2 = UnicodeString::length((UnicodeString *)local_c0);
      FieldPosition::setEndIndex(pos,partSelector._4_4_ + iVar2);
      Formattable::setString(result,(UnicodeString *)((long)&matchedWord.fUnion + 0x30));
    }
    UnicodeString::~UnicodeString((UnicodeString *)local_c0);
    UnicodeString::~UnicodeString((UnicodeString *)((long)&matchedWord.fUnion + 0x30));
  }
  return;
}

Assistant:

void PluralFormat::parseType(const UnicodeString& source, const NFRule *rbnfLenientScanner, Formattable& result, FieldPosition& pos) const {
    // If no pattern was applied, return null.
    if (msgPattern.countParts() == 0) {
        pos.setBeginIndex(-1);
        pos.setEndIndex(-1);
        return;
    }
    int partIndex = 0;
    int currMatchIndex;
    int count=msgPattern.countParts();
    int startingAt = pos.getBeginIndex();
    if (startingAt < 0) {
        startingAt = 0;
    }

    // The keyword is null until we need to match against a non-explicit, not-"other" value.
    // Then we get the keyword from the selector.
    // (In other words, we never call the selector if we match against an explicit value,
    // or if the only non-explicit keyword is "other".)
    UnicodeString keyword;
    UnicodeString matchedWord;
    const UnicodeString& pattern = msgPattern.getPatternString();
    int matchedIndex = -1;
    // Iterate over (ARG_SELECTOR ARG_START message ARG_LIMIT) tuples
    // until the end of the plural-only pattern.
    while (partIndex < count) {
        const MessagePattern::Part* partSelector = &msgPattern.getPart(partIndex++);
        if (partSelector->getType() != UMSGPAT_PART_TYPE_ARG_SELECTOR) {
            // Bad format
            continue;
        }

        const MessagePattern::Part* partStart = &msgPattern.getPart(partIndex++);
        if (partStart->getType() != UMSGPAT_PART_TYPE_MSG_START) {
            // Bad format
            continue;
        }

        const MessagePattern::Part* partLimit = &msgPattern.getPart(partIndex++);
        if (partLimit->getType() != UMSGPAT_PART_TYPE_MSG_LIMIT) {
            // Bad format
            continue;
        }

        UnicodeString currArg = pattern.tempSubString(partStart->getLimit(), partLimit->getIndex() - partStart->getLimit());
        if (rbnfLenientScanner != NULL) {
            // If lenient parsing is turned ON, we've got some time consuming parsing ahead of us.
            int32_t length = -1;
            currMatchIndex = rbnfLenientScanner->findTextLenient(source, currArg, startingAt, &length);
        }
        else {
            currMatchIndex = source.indexOf(currArg, startingAt);
        }
        if (currMatchIndex >= 0 && currMatchIndex >= matchedIndex && currArg.length() > matchedWord.length()) {
            matchedIndex = currMatchIndex;
            matchedWord = currArg;
            keyword = pattern.tempSubString(partStart->getLimit(), partLimit->getIndex() - partStart->getLimit());
        }
    }
    if (matchedIndex >= 0) {
        pos.setBeginIndex(matchedIndex);
        pos.setEndIndex(matchedIndex + matchedWord.length());
        result.setString(keyword);
        return;
    }

    // Not found!
    pos.setBeginIndex(-1);
    pos.setEndIndex(-1);
}